

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear.h
# Opt level: O0

void ncnn::resize_bilinear_image(Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float *pfVar9;
  long in_RCX;
  float *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float *in_R8;
  long in_R9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  __m128 _D_1;
  __m128 _rows1_1;
  __m128 _rows0_1;
  __m128 _b1_128;
  __m128 _b0_128;
  __m256 _D;
  __m256 _rows1;
  __m256 _rows0;
  __m256 _b1_256;
  __m256 _b0_256;
  int dx;
  float *Dp;
  float *rows1p;
  float *rows0p;
  float b1;
  float b0;
  float a1_1;
  float a0_1;
  float *S1p_1;
  float *S0p;
  int sx_1;
  int dx_2;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_1;
  float *S1_1;
  float *S0;
  float a1;
  float a0;
  float *S1p;
  int sx;
  int dx_1;
  float *rows1p_1;
  float *alphap;
  float *S1;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows1;
  float *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_fffffffffffff830;
  size_t in_stack_fffffffffffff838;
  undefined8 in_stack_fffffffffffff840;
  int _w;
  float **ppfVar12;
  Mat *in_stack_fffffffffffff848;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  int local_584;
  float *local_580;
  float *local_578;
  float *local_570;
  float local_568;
  float local_564;
  float local_560;
  float local_55c;
  float *local_558;
  float *local_550;
  int local_548;
  int local_544;
  float *local_540;
  float *local_538;
  float *local_530;
  long local_528;
  long local_520;
  float local_518;
  float local_514;
  float *local_510;
  int local_508;
  int local_504;
  float *local_500;
  float *local_4f8;
  long local_4f0;
  float *local_4e8;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  float *local_4d0;
  float *local_4c8;
  float *local_4b0;
  int *local_4a8;
  undefined8 local_4a0;
  undefined4 local_498;
  long *local_490;
  undefined4 local_488;
  undefined4 local_484;
  undefined4 local_480;
  undefined4 local_47c;
  undefined4 local_478;
  undefined8 local_470;
  float *local_468;
  int *local_460;
  undefined8 local_458;
  undefined4 local_450;
  long *local_448;
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined8 local_428;
  int local_420;
  int local_41c;
  long local_418;
  float *local_410;
  long local_408;
  float *local_400;
  long *local_3f8;
  long *local_3f0;
  float **local_3e8;
  float **local_3d8;
  int local_3c4;
  long *local_3c0;
  int local_3b4;
  long *local_3b0;
  int local_3a4;
  long *local_3a0;
  int local_394;
  long *local_390;
  float local_388;
  float local_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float local_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float local_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float *local_208;
  int local_1f0;
  undefined4 local_1ec;
  float **local_1e8;
  int local_1d0;
  undefined4 local_1cc;
  float **local_1c8;
  float *local_1c0;
  float *local_1b0;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float *local_188;
  undefined1 local_180 [32];
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  undefined1 local_140 [32];
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float **local_a0;
  float **local_98;
  undefined8 local_90;
  undefined8 local_88;
  int local_7c;
  float **local_78;
  undefined8 local_70;
  undefined8 local_68;
  int local_5c;
  float **local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  _w = (int)((ulong)in_stack_fffffffffffff840 >> 0x20);
  local_41c = *(int *)((long)in_RSI + 0x2c);
  local_420 = (int)in_RSI[6];
  local_78 = &local_468;
  local_88 = 4;
  local_90 = 0;
  local_468 = (float *)0x0;
  local_460 = (int *)0x0;
  local_458 = 0;
  local_450 = 0;
  local_448 = (long *)0x0;
  local_440 = 0;
  local_43c = 0;
  local_438 = 0;
  local_434 = 0;
  local_430 = 0;
  local_428 = 0;
  local_418 = in_R9;
  local_410 = in_R8;
  local_408 = in_RCX;
  local_400 = in_RDX;
  local_3f8 = in_RSI;
  local_3f0 = in_RDI;
  local_7c = local_41c;
  Mat::create(in_stack_fffffffffffff848,_w,in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  local_58 = &local_4b0;
  local_5c = local_41c;
  local_68 = 4;
  local_70 = 0;
  local_4b0 = (float *)0x0;
  local_4a8 = (int *)0x0;
  local_4a0 = 0;
  local_498 = 0;
  local_490 = (long *)0x0;
  local_488 = 0;
  local_484 = 0;
  local_480 = 0;
  local_47c = 0;
  local_478 = 0;
  local_470 = 0;
  Mat::create(in_stack_fffffffffffff848,_w,in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  local_98 = &local_468;
  local_4c8 = local_468;
  local_a0 = &local_4b0;
  local_4d0 = local_4b0;
  local_4d4 = -2;
  for (local_4d8 = 0; pfVar9 = local_4c8, local_4d8 < local_420; local_4d8 = local_4d8 + 1) {
    local_4dc = *(int *)(local_418 + (long)local_4d8 * 4);
    if (local_4dc != local_4d4) {
      if (local_4dc == local_4d4 + 1) {
        local_4e8 = local_4c8;
        local_4c8 = local_4d0;
        local_4d0 = pfVar9;
        local_3a4 = local_4dc + 1;
        local_3a0 = local_3f0;
        local_4f0 = *local_3f0 +
                    (long)*(int *)((long)local_3f0 + 0x2c) * (long)local_3a4 * local_3f0[2];
        local_4f8 = local_400;
        local_500 = pfVar9;
        for (local_504 = 0; local_504 < local_41c; local_504 = local_504 + 1) {
          local_508 = *(int *)(local_408 + (long)local_504 * 4);
          local_510 = (float *)(local_4f0 + (long)local_508 * 4);
          local_514 = *local_4f8;
          local_518 = local_4f8[1];
          pfVar9[local_504] = *local_510 * local_514 + local_510[1] * local_518;
          local_4f8 = local_4f8 + 2;
        }
      }
      else {
        local_3b0 = local_3f0;
        local_520 = *local_3f0 +
                    (long)*(int *)((long)local_3f0 + 0x2c) * (long)local_4dc * local_3f0[2];
        local_3c4 = local_4dc + 1;
        local_3c0 = local_3f0;
        local_528 = *local_3f0 +
                    (long)*(int *)((long)local_3f0 + 0x2c) * (long)local_3c4 * local_3f0[2];
        local_530 = local_400;
        local_538 = local_4c8;
        local_540 = local_4d0;
        for (local_544 = 0; local_3b4 = local_4dc, local_544 < local_41c; local_544 = local_544 + 1)
        {
          local_548 = *(int *)(local_408 + (long)local_544 * 4);
          local_550 = (float *)(local_520 + (long)local_548 * 4);
          local_558 = (float *)(local_528 + (long)local_548 * 4);
          local_55c = *local_530;
          local_560 = local_530[1];
          local_4c8[local_544] = *local_550 * local_55c + local_550[1] * local_560;
          local_4d0[local_544] = *local_558 * local_55c + local_558[1] * local_560;
          local_530 = local_530 + 2;
        }
      }
    }
    local_564 = *local_410;
    local_568 = local_410[1];
    local_570 = local_4c8;
    local_578 = local_4d0;
    local_390 = local_3f8;
    local_394 = local_4d8;
    local_580 = (float *)(*local_3f8 +
                         (long)*(int *)((long)local_3f8 + 0x2c) * (long)local_4d8 * local_3f8[2]);
    local_584 = 0;
    auVar1 = vinsertps_avx(ZEXT416((uint)local_564),ZEXT416((uint)local_564),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_564),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_564),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)local_564),ZEXT416((uint)local_564),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_564),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_564),0x30);
    auVar10._16_16_ = auVar1;
    auVar10._0_16_ = auVar2;
    local_180._0_8_ = auVar2._0_8_;
    local_180._8_8_ = auVar2._8_8_;
    local_180._16_8_ = auVar1._0_8_;
    local_180._24_8_ = auVar1._8_8_;
    local_5c0 = local_180._0_8_;
    uStack_5b8 = local_180._8_8_;
    uStack_5b0 = local_180._16_8_;
    uStack_5a8 = local_180._24_8_;
    auVar3 = vinsertps_avx(ZEXT416((uint)local_568),ZEXT416((uint)local_568),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_568),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_568),0x30);
    auVar4 = vinsertps_avx(ZEXT416((uint)local_568),ZEXT416((uint)local_568),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_568),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_568),0x30);
    auVar11._16_16_ = auVar3;
    auVar11._0_16_ = auVar4;
    local_140._0_8_ = auVar4._0_8_;
    local_140._8_8_ = auVar4._8_8_;
    local_140._16_8_ = auVar3._0_8_;
    local_140._24_8_ = auVar3._8_8_;
    local_5e0 = local_140._0_8_;
    uStack_5d8 = local_140._8_8_;
    uStack_5d0 = local_140._16_8_;
    uStack_5c8 = local_140._24_8_;
    for (; local_584 + 7 < local_41c; local_584 = local_584 + 8) {
      local_48 = local_570;
      local_600 = *(undefined8 *)local_570;
      uStack_5f8 = *(undefined8 *)(local_570 + 2);
      uStack_5f0 = *(undefined8 *)(local_570 + 4);
      uStack_5e8 = *(undefined8 *)(local_570 + 6);
      local_50 = local_578;
      uVar5 = *(undefined8 *)local_578;
      uVar6 = *(undefined8 *)(local_578 + 2);
      uVar7 = *(undefined8 *)(local_578 + 4);
      uVar8 = *(undefined8 *)(local_578 + 6);
      local_360._0_4_ = (float)local_600;
      local_360._4_4_ = (float)((ulong)local_600 >> 0x20);
      uStack_358._0_4_ = (float)uStack_5f8;
      uStack_358._4_4_ = (float)((ulong)uStack_5f8 >> 0x20);
      uStack_350._0_4_ = (float)uStack_5f0;
      uStack_350._4_4_ = (float)((ulong)uStack_5f0 >> 0x20);
      uStack_348._0_4_ = (float)uStack_5e8;
      uStack_348._4_4_ = (float)((ulong)uStack_5e8 >> 0x20);
      local_380._0_4_ = auVar2._0_4_;
      local_380._4_4_ = auVar2._4_4_;
      uStack_378._0_4_ = auVar2._8_4_;
      uStack_378._4_4_ = auVar2._12_4_;
      uStack_370._0_4_ = auVar1._0_4_;
      uStack_370._4_4_ = auVar1._4_4_;
      uStack_368._0_4_ = auVar1._8_4_;
      local_640 = CONCAT44(local_360._4_4_ * local_380._4_4_,(float)local_360 * (float)local_380);
      uStack_638 = CONCAT44(uStack_358._4_4_ * uStack_378._4_4_,
                            (float)uStack_358 * (float)uStack_378);
      uStack_630 = CONCAT44(uStack_350._4_4_ * uStack_370._4_4_,
                            (float)uStack_350 * (float)uStack_370);
      uStack_628 = CONCAT44(uStack_348._4_4_,(float)uStack_348 * (float)uStack_368);
      local_328 = &local_620;
      local_330 = &local_5e0;
      local_338 = &local_640;
      local_620._0_4_ = (float)uVar5;
      local_300 = (float)local_620;
      local_620._4_4_ = (float)((ulong)uVar5 >> 0x20);
      fStack_2fc = local_620._4_4_;
      uStack_618._0_4_ = (float)uVar6;
      fStack_2f8 = (float)uStack_618;
      uStack_618._4_4_ = (float)((ulong)uVar6 >> 0x20);
      fStack_2f4 = uStack_618._4_4_;
      uStack_610._0_4_ = (float)uVar7;
      fStack_2f0 = (float)uStack_610;
      uStack_610._4_4_ = (float)((ulong)uVar7 >> 0x20);
      fStack_2ec = uStack_610._4_4_;
      uStack_608._0_4_ = (float)uVar8;
      fStack_2e8 = (float)uStack_608;
      uStack_608._4_4_ = (float)((ulong)uVar8 >> 0x20);
      fStack_2e4 = uStack_608._4_4_;
      local_320._0_4_ = auVar4._0_4_;
      local_320._4_4_ = auVar4._4_4_;
      uStack_318._0_4_ = auVar4._8_4_;
      uStack_318._4_4_ = auVar4._12_4_;
      uStack_310._0_4_ = auVar3._0_4_;
      uStack_310._4_4_ = auVar3._4_4_;
      uStack_308._0_4_ = auVar3._8_4_;
      local_e0 = (float)local_620 * (float)local_320;
      fStack_dc = local_620._4_4_ * local_320._4_4_;
      fStack_d8 = (float)uStack_618 * (float)uStack_318;
      fStack_d4 = uStack_618._4_4_ * uStack_318._4_4_;
      fStack_d0 = (float)uStack_610 * (float)uStack_310;
      fStack_cc = uStack_610._4_4_ * uStack_310._4_4_;
      fStack_c8 = (float)uStack_608 * (float)uStack_308;
      local_100 = local_640;
      uStack_f8 = uStack_638;
      uStack_f0 = uStack_630;
      uStack_e8 = uStack_628;
      local_640 = CONCAT44(fStack_dc + local_360._4_4_ * local_380._4_4_,
                           local_e0 + (float)local_360 * (float)local_380);
      uStack_638 = CONCAT44(fStack_d4 + uStack_358._4_4_ * uStack_378._4_4_,
                            fStack_d8 + (float)uStack_358 * (float)uStack_378);
      uStack_630 = CONCAT44(fStack_cc + uStack_350._4_4_ * uStack_370._4_4_,
                            fStack_d0 + (float)uStack_350 * (float)uStack_370);
      uStack_628 = CONCAT44(uStack_608._4_4_ + uStack_348._4_4_,
                            fStack_c8 + (float)uStack_348 * (float)uStack_368);
      local_208 = local_580;
      *(undefined8 *)local_580 = local_640;
      *(undefined8 *)(local_580 + 2) = uStack_638;
      *(undefined8 *)(local_580 + 4) = uStack_630;
      *(undefined8 *)(local_580 + 6) = uStack_628;
      local_580 = local_580 + 8;
      local_570 = local_570 + 8;
      local_578 = local_578 + 8;
      local_620 = uVar5;
      uStack_618 = uVar6;
      uStack_610 = uVar7;
      uStack_608 = uVar8;
      local_380 = local_180._0_8_;
      uStack_378 = local_180._8_8_;
      uStack_370 = local_180._16_8_;
      uStack_368 = local_180._24_8_;
      local_360 = local_600;
      uStack_358 = uStack_5f8;
      uStack_350 = uStack_5f0;
      uStack_348 = uStack_5e8;
      local_320 = local_140._0_8_;
      uStack_318 = local_140._8_8_;
      uStack_310 = local_140._16_8_;
      uStack_308 = local_140._24_8_;
      local_240 = local_640;
      uStack_238 = uStack_638;
      uStack_230 = uStack_630;
      uStack_228 = uStack_628;
      fStack_c4 = fStack_2e4;
    }
    local_650 = CONCAT44(local_564,local_564);
    uStack_648 = CONCAT44(local_564,local_564);
    local_660 = CONCAT44(local_568,local_568);
    uStack_658 = CONCAT44(local_568,local_568);
    for (; local_584 + 3 < local_41c; local_584 = local_584 + 4) {
      local_38 = local_570;
      local_670 = *(undefined8 *)local_570;
      uStack_668 = *(undefined8 *)(local_570 + 2);
      local_40 = local_578;
      local_680 = *(undefined8 *)local_578;
      uStack_678 = *(undefined8 *)(local_578 + 2);
      local_290._0_4_ = (float)local_670;
      local_290._4_4_ = (float)((ulong)local_670 >> 0x20);
      uStack_288._0_4_ = (float)uStack_668;
      uStack_288._4_4_ = (float)((ulong)uStack_668 >> 0x20);
      local_690 = CONCAT44(local_290._4_4_ * local_564,(float)local_290 * local_564);
      uStack_688 = CONCAT44(uStack_288._4_4_ * local_564,(float)uStack_288 * local_564);
      local_268 = &local_680;
      local_270 = &local_660;
      local_278 = &local_690;
      local_250._0_4_ = (float)local_680;
      local_250._4_4_ = (float)((ulong)local_680 >> 0x20);
      uStack_248._0_4_ = (float)uStack_678;
      uStack_248._4_4_ = (float)((ulong)uStack_678 >> 0x20);
      local_b0 = (float)local_250 * local_568;
      fStack_ac = local_250._4_4_ * local_568;
      fStack_a8 = (float)uStack_248 * local_568;
      fStack_a4 = uStack_248._4_4_ * local_568;
      local_c0 = local_690;
      uStack_b8 = uStack_688;
      local_690 = CONCAT44(fStack_ac + local_290._4_4_ * local_564,
                           local_b0 + (float)local_290 * local_564);
      uStack_688 = CONCAT44(fStack_a4 + uStack_288._4_4_ * local_564,
                            fStack_a8 + (float)uStack_288 * local_564);
      local_188 = local_580;
      *(undefined8 *)local_580 = local_690;
      *(undefined8 *)(local_580 + 2) = uStack_688;
      local_580 = local_580 + 4;
      local_570 = local_570 + 4;
      local_578 = local_578 + 4;
      local_2a0 = local_650;
      uStack_298 = uStack_648;
      local_290 = local_670;
      uStack_288 = uStack_668;
      local_260 = local_660;
      uStack_258 = uStack_658;
      local_250 = local_680;
      uStack_248 = uStack_678;
      local_1a0 = local_690;
      uStack_198 = uStack_688;
    }
    for (; local_584 < local_41c; local_584 = local_584 + 1) {
      *local_580 = *local_570 * local_564 + *local_578 * local_568;
      local_580 = local_580 + 1;
      local_578 = local_578 + 1;
      local_570 = local_570 + 1;
    }
    local_410 = local_410 + 2;
    local_4d4 = local_4dc;
    local_388 = local_568;
    local_384 = local_564;
    local_2e0 = local_568;
    fStack_2dc = local_568;
    fStack_2d8 = local_568;
    fStack_2d4 = local_568;
    local_2c4 = local_568;
    local_2c0 = local_564;
    fStack_2bc = local_564;
    fStack_2b8 = local_564;
    fStack_2b4 = local_564;
    local_2a4 = local_564;
    local_180 = auVar10;
    local_160 = local_564;
    local_15c = local_564;
    local_158 = local_564;
    local_154 = local_564;
    local_150 = local_564;
    local_14c = local_564;
    local_148 = local_564;
    local_144 = local_564;
    local_140 = auVar11;
    local_120 = local_568;
    local_11c = local_568;
    local_118 = local_568;
    local_114 = local_568;
    local_110 = local_568;
    local_10c = local_568;
    local_108 = local_568;
    local_104 = local_568;
  }
  ppfVar12 = &local_4b0;
  local_3e8 = ppfVar12;
  local_1c8 = ppfVar12;
  if (local_4a8 != (int *)0x0) {
    local_1cc = 0xffffffff;
    LOCK();
    local_1d0 = *local_4a8;
    *local_4a8 = *local_4a8 + -1;
    UNLOCK();
    if (local_1d0 == 1) {
      if (local_490 == (long *)0x0) {
        local_1c0 = local_4b0;
        if (local_4b0 != (float *)0x0) {
          free(local_4b0);
        }
      }
      else {
        (**(code **)(*local_490 + 0x18))(local_490,local_4b0);
      }
    }
  }
  *ppfVar12 = (float *)0x0;
  ppfVar12[2] = (float *)0x0;
  *(undefined4 *)(ppfVar12 + 3) = 0;
  *(undefined4 *)(ppfVar12 + 5) = 0;
  *(undefined4 *)((long)ppfVar12 + 0x2c) = 0;
  *(undefined4 *)(ppfVar12 + 6) = 0;
  *(undefined4 *)((long)ppfVar12 + 0x34) = 0;
  *(undefined4 *)(ppfVar12 + 7) = 0;
  ppfVar12[8] = (float *)0x0;
  ppfVar12[1] = (float *)0x0;
  ppfVar12 = &local_468;
  if (local_460 != (int *)0x0) {
    local_1ec = 0xffffffff;
    LOCK();
    local_1f0 = *local_460;
    *local_460 = *local_460 + -1;
    UNLOCK();
    if (local_1f0 == 1) {
      local_3d8 = ppfVar12;
      local_1e8 = ppfVar12;
      if (local_448 == (long *)0x0) {
        local_1b0 = local_468;
        if (local_468 != (float *)0x0) {
          free(local_468);
        }
      }
      else {
        (**(code **)(*local_448 + 0x18))(local_448,local_468);
      }
    }
  }
  *ppfVar12 = (float *)0x0;
  ppfVar12[2] = (float *)0x0;
  *(undefined4 *)(ppfVar12 + 3) = 0;
  *(undefined4 *)(ppfVar12 + 5) = 0;
  *(undefined4 *)((long)ppfVar12 + 0x2c) = 0;
  *(undefined4 *)(ppfVar12 + 6) = 0;
  *(undefined4 *)((long)ppfVar12 + 0x34) = 0;
  *(undefined4 *)(ppfVar12 + 7) = 0;
  ppfVar12[8] = (float *)0x0;
  ppfVar12[1] = (float *)0x0;
  return;
}

Assistant:

static void resize_bilinear_image(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w);
    Mat rowsbuf1(w);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows1p[dx] = S1p[0] * a0 + S1p[1] * a1;

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows0p[dx] = S0p[0] * a0 + S0p[1] * a1;
                rows1p[dx] = S1p[0] * a0 + S1p[1] * a1;

                alphap += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);

        int dx = 0;
#if __SSE2__
#if __AVX__
        __m256 _b0_256 = _mm256_set1_ps(b0);
        __m256 _b1_256 = _mm256_set1_ps(b1);
        for (; dx + 7 < w; dx += 8)
        {
            __m256 _rows0 = _mm256_loadu_ps(rows0p);
            __m256 _rows1 = _mm256_loadu_ps(rows1p);
            __m256 _D = _mm256_mul_ps(_rows0, _b0_256);
            _D = _mm256_comp_fmadd_ps(_rows1, _b1_256, _D);
            _mm256_storeu_ps(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#endif // __AVX__
        __m128 _b0_128 = _mm_set1_ps(b0);
        __m128 _b1_128 = _mm_set1_ps(b1);
        for (; dx + 3 < w; dx += 4)
        {
            __m128 _rows0 = _mm_loadu_ps(rows0p);
            __m128 _rows1 = _mm_loadu_ps(rows1p);
            __m128 _D = _mm_mul_ps(_rows0, _b0_128);
            _D = _mm_comp_fmadd_ps(_rows1, _b1_128, _D);
            _mm_storeu_ps(Dp, _D);

            Dp += 4;
            rows0p += 4;
            rows1p += 4;
        }
#endif // __SSE2__
        for (; dx < w; dx++)
        {
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1;
        }

        beta += 2;
    }
}